

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O2

void __thiscall
TPZFront<std::complex<double>_>::PrintGlobal
          (TPZFront<std::complex<double>_> *this,char *name,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,name);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Not implemented in the abstract Class !");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Try one of the subclasses");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void TPZFront<TVar>::PrintGlobal(const char *name, std::ostream& out){
	out << name << endl;
	/*
	 int i, j;
	 for(i=0;i<fLocal.NElements();i++){
	 if(fLocal[i]!=-1) out << i << " ";
	 }
	 out << endl;
	 for(i=0;i<fLocal.NElements();i++){
	 if(fLocal[i]==-1) continue;
	 for(j=0;j<fLocal.NElements();j++){
	 if(fLocal[j]==-1) continue;
	 out << Element(fLocal[i],fLocal[j]) << " ";
	 }
	 out << endl;
	 }
	 out << endl;
	 */
	out << "Not implemented in the abstract Class !" << endl;
	out << "Try one of the subclasses" << endl;
}